

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_streamable<trng::beta_dist<long_double>>(beta_dist<long_double> *d)

{
  longdouble lVar1;
  param_type p_new;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  StringRef local_258;
  param_type local_248;
  AssertionHandler local_210;
  StringRef local_1c8;
  SourceLineInfo local_1b8;
  stringstream local_1a8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_198 [112];
  ios_base local_128 [264];
  
  local_248.alpha_._0_10_ = (longdouble)1;
  local_248.beta_._0_10_ = local_248.alpha_._0_10_;
  trng::math::detail::Beta<long_double>
            ((longdouble *)d,local_248.alpha_._0_10_,local_248.alpha_._0_10_);
  std::__cxx11::stringstream::stringstream(local_1a8);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a8,&local_248);
  lVar1 = local_248.alpha_._0_10_;
  local_258.m_start = "REQUIRE";
  local_258.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b8.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c8,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler(&local_210,&local_258,&local_1b8,local_1c8,Normal);
  local_258.m_start =
       (char *)CONCAT71(local_258.m_start._1_7_,lVar1 == *(longdouble *)&(d->P).alpha_);
  Catch::AssertionHandler::handleExpr<bool>(&local_210,(ExprLhs<bool> *)&local_258);
  Catch::AssertionHandler::complete(&local_210);
  if (local_210.m_completed == false) {
    (*(local_210.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}